

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ravi_alloc.c
# Opt level: O3

void ** ialloc(mstate m,size_t n_elements,size_t *sizes,int opts,void **chunks)

{
  uint uVar1;
  void *__s;
  long lVar2;
  void **ppvVar3;
  size_t sVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (mparams.magic == 0) {
    init_mparams();
  }
  if (chunks == (void **)0x0) {
    if (n_elements == 0) {
      ppvVar3 = (void **)mspace_malloc(m,0);
      return ppvVar3;
    }
    uVar7 = 0x20;
    if (0x16 < n_elements * 8) {
      uVar7 = n_elements * 8 + 0x17 & 0xfffffffffffffff0;
    }
  }
  else {
    if (n_elements == 0) {
      return chunks;
    }
    uVar7 = 0;
  }
  if ((opts & 1U) == 0) {
    uVar8 = 0;
    sVar4 = 0;
    uVar5 = 0;
    do {
      uVar6 = sizes[sVar4] + 0x17 & 0xfffffffffffffff0;
      if (sizes[sVar4] < 0x17) {
        uVar6 = 0x20;
      }
      uVar5 = uVar5 + uVar6;
      sVar4 = sVar4 + 1;
    } while (n_elements != sVar4);
  }
  else {
    uVar8 = 0x20;
    if (0x16 < *sizes) {
      uVar8 = *sizes + 0x17 & 0xfffffffffffffff0;
    }
    uVar5 = uVar8 * n_elements;
  }
  uVar1 = m->mflags;
  m->mflags = uVar1 & 0xfffffffe;
  __s = mspace_malloc(m,(uVar7 + uVar5) - 8);
  if ((uVar1 & 1) != 0) {
    *(byte *)&m->mflags = (byte)m->mflags | 1;
  }
  if (__s == (void *)0x0) {
    chunks = (void **)0x0;
  }
  else {
    uVar6 = *(ulong *)((long)__s + -8) & 0xfffffffffffffff8;
    if ((opts & 2U) != 0) {
      memset(__s,0,(uVar6 - uVar7) - 8);
    }
    lVar9 = (long)__s + -0x10;
    if (chunks == (void **)0x0) {
      chunks = (void **)(uVar5 + 0x10 + lVar9);
      chunks[-1] = (void *)(uVar6 - uVar5 | 3);
      uVar6 = uVar5;
    }
    *chunks = __s;
    if (n_elements != 1) {
      lVar2 = 0;
      lVar10 = lVar9;
      do {
        uVar7 = uVar8;
        if ((uVar8 == 0) && (uVar7 = sizes[lVar2] + 0x17 & 0xfffffffffffffff0, sizes[lVar2] < 0x17))
        {
          uVar7 = 0x20;
        }
        uVar6 = uVar6 - uVar7;
        *(ulong *)(lVar10 + 8) = uVar7 | 3;
        lVar9 = uVar7 + lVar10;
        chunks[lVar2 + 1] = (void *)(uVar7 + lVar10 + 0x10);
        lVar2 = lVar2 + 1;
        lVar10 = lVar9;
      } while (n_elements - 1 != lVar2);
    }
    *(ulong *)(lVar9 + 8) = uVar6 | 3;
  }
  return chunks;
}

Assistant:

static void** ialloc(mstate m,
                     size_t n_elements,
                     size_t* sizes,
                     int opts,
                     void* chunks[]) {

  size_t    element_size;   /* chunksize of each element, if all same */
  size_t    contents_size;  /* total size of elements */
  size_t    array_size;     /* request size of pointer array */
  void*     mem;            /* malloced aggregate space */
  mchunkptr p;              /* corresponding chunk */
  size_t    remainder_size; /* remaining bytes while splitting */
  void**    marray;         /* either "chunks" or malloced ptr array */
  mchunkptr array_chunk;    /* chunk for malloced ptr array */
  flag_t    was_enabled;    /* to disable mmap */
  size_t    size;
  size_t    i;

  ensure_initialization();
  /* compute array length, if needed */
  if (chunks != 0) {
    if (n_elements == 0)
      return chunks; /* nothing to do */
    marray = chunks;
    array_size = 0;
  }
  else {
    /* if empty req, must still return chunk representing empty array */
    if (n_elements == 0)
      return (void**)internal_malloc(m, 0);
    marray = 0;
    array_size = request2size(n_elements * (sizeof(void*)));
  }

  /* compute total element size */
  if (opts & 0x1) { /* all-same-size */
    element_size = request2size(*sizes);
    contents_size = n_elements * element_size;
  }
  else { /* add up all the sizes */
    element_size = 0;
    contents_size = 0;
    for (i = 0; i != n_elements; ++i)
      contents_size += request2size(sizes[i]);
  }

  size = contents_size + array_size;

  /*
     Allocate the aggregate chunk.  First disable direct-mmapping so
     malloc won't use it, since we would not be able to later
     free/realloc space internal to a segregated mmap region.
  */
  was_enabled = use_mmap(m);
  disable_mmap(m);
  mem = internal_malloc(m, size - CHUNK_OVERHEAD);
  if (was_enabled)
    enable_mmap(m);
  if (mem == 0)
    return 0;

  if (PREACTION(m)) return 0;
  p = mem2chunk(mem);
  remainder_size = chunksize(p);

  assert(!is_mmapped(p));

  if (opts & 0x2) {       /* optionally clear the elements */
    memset((size_t*)mem, 0, remainder_size - SIZE_T_SIZE - array_size);
  }

  /* If not provided, allocate the pointer array as final part of chunk */
  if (marray == 0) {
    size_t  array_chunk_size;
    array_chunk = chunk_plus_offset(p, contents_size);
    array_chunk_size = remainder_size - contents_size;
    marray = (void**) (chunk2mem(array_chunk));
    set_size_and_pinuse_of_inuse_chunk(m, array_chunk, array_chunk_size);
    remainder_size = contents_size;
  }

  /* split out elements */
  for (i = 0; ; ++i) {
    marray[i] = chunk2mem(p);
    if (i != n_elements-1) {
      if (element_size != 0)
        size = element_size;
      else
        size = request2size(sizes[i]);
      remainder_size -= size;
      set_size_and_pinuse_of_inuse_chunk(m, p, size);
      p = chunk_plus_offset(p, size);
    }
    else { /* the final element absorbs any overallocation slop */
      set_size_and_pinuse_of_inuse_chunk(m, p, remainder_size);
      break;
    }
  }

#if DEBUG
  if (marray != chunks) {
    /* final element must have exactly exhausted chunk */
    if (element_size != 0) {
      assert(remainder_size == element_size);
    }
    else {
      assert(remainder_size == request2size(sizes[i]));
    }
    check_inuse_chunk(m, mem2chunk(marray));
  }
  for (i = 0; i != n_elements; ++i)
    check_inuse_chunk(m, mem2chunk(marray[i]));

#endif /* DEBUG */

  POSTACTION(m);
  return marray;
}